

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  pointer pcVar1;
  cmCommand *this_00;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  MatchProperties match_properties;
  string newToFile;
  string newFromFile;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (fromFile->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"INSTALL encountered an empty string input file name.",0x34);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar3 = 0;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    uVar3 = 1;
    if ((((ulong)match_properties & 1) == 0) &&
       (bVar2 = cmsys::SystemTools::SameFile(fromFile,toFile), !bVar2)) {
      pcVar1 = (fromFile->_M_dataplus)._M_p;
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar1,pcVar1 + fromFile->_M_string_length);
      pcVar1 = (toFile->_M_dataplus)._M_p;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar1,pcVar1 + toFile->_M_string_length);
      if ((this->FollowSymlinkChain != true) ||
         (bVar2 = InstallSymlinkChain(this,local_1a8,&local_1c8), bVar2)) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(local_1a8);
        if (bVar2) {
          uVar3 = InstallSymlink(this,local_1a8,&local_1c8);
        }
        else {
          bVar2 = cmsys::SystemTools::FileIsDirectory(local_1a8);
          if (bVar2) {
            uVar3 = InstallDirectory(this,local_1a8,&local_1c8,match_properties);
          }
          else {
            bVar2 = cmsys::SystemTools::FileExists(local_1a8);
            if (bVar2) {
              uVar3 = InstallFile(this,local_1a8,&local_1c8,match_properties);
            }
            else {
              iVar4 = (*this->_vptr_cmFileCopier[5])(this,local_1a8);
              uVar3 = (undefined1)iVar4;
            }
          }
        }
      }
      else {
        uVar3 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  return (bool)uVar3;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}